

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::MatchesFilter(string *name_str,char *filter)

{
  byte bVar1;
  char *in_RSI;
  string *in_stack_00000088;
  UnitTestFilter *in_stack_00000090;
  undefined7 in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff68;
  UnitTestFilter *in_stack_ffffffffffffff70;
  allocator local_81;
  string local_80 [128];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,in_RSI,&local_81);
  anon_unknown_36::UnitTestFilter::UnitTestFilter(in_stack_00000090,in_stack_00000088);
  bVar1 = anon_unknown_36::UnitTestFilter::MatchesName
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  anon_unknown_36::UnitTestFilter::~UnitTestFilter
            ((UnitTestFilter *)CONCAT17(bVar1,in_stack_ffffffffffffff50));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return (bool)(bVar1 & 1);
}

Assistant:

bool UnitTestOptions::MatchesFilter(const std::string& name_str,
                                    const char* filter) {
  return UnitTestFilter(filter).MatchesName(name_str);
}